

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void codeunexpval(FuncState *fs,OpCode op,expdesc *e,int line)

{
  int iVar1;
  ravi_type_map rVar2;
  int r;
  int line_local;
  expdesc *e_local;
  OpCode op_local;
  FuncState *fs_local;
  
  iVar1 = luaK_exp2anyreg(fs,e);
  freeexp(fs,e);
  if (op == OP_UNM) {
    iVar1 = luaK_codeABC(fs,OP_UNM,0,iVar1,0);
    (e->u).info = iVar1;
    if ((e->ravi_type_map & 0xffffffe7) != 0) {
      e->ravi_type_map = 0xffffffff;
    }
  }
  else if (op == OP_BNOT) {
    if (e->ravi_type_map == 8) {
      iVar1 = luaK_codeABC(fs,OP_RAVI_BNOT_I,0,iVar1,0);
      (e->u).info = iVar1;
    }
    else {
      iVar1 = luaK_codeABC(fs,OP_BNOT,0,iVar1,0);
      (e->u).info = iVar1;
      rVar2 = 0xffffffff;
      if (e->ravi_type_map == 0x10) {
        rVar2 = 8;
      }
      e->ravi_type_map = rVar2;
    }
  }
  else if (op == OP_LEN) {
    iVar1 = luaK_codeABC(fs,OP_LEN,0,iVar1,0);
    (e->u).info = iVar1;
    if ((e->ravi_type_map & 0xfffffe9f) == 0) {
      e->ravi_type_map = 8;
    }
    else {
      if ((e->ravi_type_map & 0xfffffe1f) == 0) {
        e->k = VRELOCABLE;
        luaK_exp2anyreg(fs,e);
        luaK_codeABC(fs,OP_RAVI_TOINT,(e->u).info,0,0);
        e->ravi_type_map = 8;
        luaK_fixline(fs,line);
        return;
      }
      e->ravi_type_map = 0xffffffff;
    }
  }
  else {
    iVar1 = luaK_codeABC(fs,op,0,iVar1,0);
    (e->u).info = iVar1;
    e->ravi_type_map = 0xffffffff;
  }
  e->k = VRELOCABLE;
  luaK_fixline(fs,line);
  return;
}

Assistant:

static void codeunexpval (FuncState *fs, OpCode op, expdesc *e, int line) {
  int r = luaK_exp2anyreg(fs, e);  /* opcodes operate only on registers */
  freeexp(fs, e);
  switch (op) {
    case OP_BNOT:
      if (e->ravi_type_map == RAVI_TM_INTEGER) {
        e->u.info = luaK_codeABC(fs, OP_RAVI_BNOT_I, 0, r, 0);
        break;
      }
      e->u.info = luaK_codeABC(fs, OP_BNOT, 0, r, 0);
      e->ravi_type_map = e->ravi_type_map == RAVI_TM_FLOAT ? RAVI_TM_INTEGER : RAVI_TM_ANY;
      break;
    case OP_LEN:
      e->u.info = luaK_codeABC(fs, OP_LEN, 0, r, 0);
      if ((e->ravi_type_map & (~(RAVI_TM_INTEGER_ARRAY | RAVI_TM_FLOAT_ARRAY | RAVI_TM_STRING))) == 0) {
        e->ravi_type_map = RAVI_TM_INTEGER;
      }
      else if ((e->ravi_type_map & (~(RAVI_TM_INTEGER_ARRAY | RAVI_TM_FLOAT_ARRAY | RAVI_TM_STRING | RAVI_TM_TABLE))) == 0) {
        e->k = VRELOCABLE;
        luaK_exp2anyreg(fs, e);
        /* This is not incompatible with lua since a type annotation is require to get here or the table trivially has
         * no metatable */
        luaK_codeABC(fs, OP_RAVI_TOINT, e->u.info, 0, 0);
        e->ravi_type_map = RAVI_TM_INTEGER;
        luaK_fixline(fs, line);
        return;
      }
      else {
        e->ravi_type_map = RAVI_TM_ANY;
      }
      break;
    case OP_UNM:
      e->u.info = luaK_codeABC(fs, OP_UNM, 0, r, 0);
      if (e->ravi_type_map & ~RAVI_TM_NUMBER) {
        e->ravi_type_map = RAVI_TM_ANY;
      }
      break;
    default:
      e->u.info = luaK_codeABC(fs, op, 0, r, 0);
      e->ravi_type_map = RAVI_TM_ANY;
  }
  e->k = VRELOCABLE;  /* all those operations are relocatable */
  luaK_fixline(fs, line);
}